

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
kratos::assign_type_to_str_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,AssignmentType type)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if ((int)this == 1) {
    __s = "non-blocking";
    __a = &local_12;
  }
  else if ((int)this == 0) {
    __s = "blocking";
    __a = &local_13;
  }
  else {
    __s = "undefined";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string assign_type_to_str(AssignmentType type) {
    if (type == AssignmentType::Blocking)
        return "blocking";
    else if (type == AssignmentType::NonBlocking)
        return "non-blocking";
    else
        return "undefined";
}